

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall mjs::parser::check_literal(parser *this)

{
  token_type tVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  wchar_t *in_RDX;
  wchar_t *in_R9;
  wstring_view s;
  wstring_view message;
  wostringstream _oss;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  uint32_t local_1b8;
  undefined4 local_1b4;
  size_t local_1b0;
  source_extend *local_1a8;
  source_extend local_190 [15];
  
  tVar1 = (this->current_token_).type_;
  if (((0x21 < tVar1 - false_) ||
      (in_RDX = (wchar_t *)0x200040001, (0x200040001U >> ((ulong)(tVar1 - false_) & 0x3f) & 1) == 0)
      ) && (1 < tVar1 - numeric_literal)) {
    __assert_fail("is_literal(tt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x1a7,"void mjs::parser::check_literal()");
  }
  if (this->strict_mode_ == true) {
    if (tVar1 == string_literal) {
      local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_190[0].start = this->token_start_;
      local_190[0].end = (uint32_t)(this->lexer_).text_pos_;
      check_string_literal(this,local_190);
      if (local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_190[0].file.
                   super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    else if (tVar1 == numeric_literal) {
      peVar2 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      s._M_len = (peVar2->text_)._M_dataplus._M_p + this->token_start_;
      s._M_str = in_RDX;
      bVar3 = is_octal_literal((mjs *)(ulong)((int)(this->lexer_).text_pos_ - this->token_start_),s)
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (bVar3) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
        std::operator<<((wostream *)local_190,"Octal literals may not be used in strict mode");
        local_1c8 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_1c0 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
          }
        }
        local_1b8 = this->token_start_;
        local_1b4 = (undefined4)(this->lexer_).text_pos_;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = local_1b0;
        syntax_error((parser *)"check_literal",(char *)0x1ac,(int)&local_1c8,local_1a8,message);
      }
    }
  }
  return;
}

Assistant:

void check_literal() {
        const auto tt = current_token_type();
        assert(is_literal(tt));
        if (!strict_mode_) {
            return;
        }
        if (tt == token_type::numeric_literal && is_octal_literal(current_extend().source_view())) {
            SYNTAX_ERROR("Octal literals may not be used in strict mode");
        } else if (tt == token_type::string_literal) {
            check_string_literal(current_extend());
        }
    }